

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_conjunctive.cpp
# Opt level: O2

string * __thiscall
ColValCondDAGNode::getLeftColName_abi_cxx11_(string *__return_storage_ptr__,ColValCondDAGNode *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->left_col_name_);
  return __return_storage_ptr__;
}

Assistant:

std::string getLeftColName() final {
        return left_col_name_;
    }